

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalCreateARTIndex::Combine
          (PhysicalCreateARTIndex *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  bool bVar2;
  pointer this_00;
  type other_index;
  ConstraintException *this_01;
  allocator local_39;
  string local_38;
  
  pLVar1 = input->local_state;
  this_00 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
            operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                        *)(input->global_state + 1));
  other_index = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
                operator*((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                           *)(pLVar1 + 1));
  bVar2 = BoundIndex::MergeIndexes(this_00,other_index);
  if (bVar2) {
    return FINISHED;
  }
  this_01 = (ConstraintException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Data contains duplicates on indexed column(s)",&local_39);
  ConstraintException::ConstraintException(this_01,&local_38);
  __cxa_throw(this_01,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkCombineResultType PhysicalCreateARTIndex::Combine(ExecutionContext &context,
                                                      OperatorSinkCombineInput &input) const {
	auto &g_state = input.global_state.Cast<CreateARTIndexGlobalSinkState>();

	// Merge the local index into the global index.
	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	if (!g_state.global_index->MergeIndexes(*l_state.local_index)) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	return SinkCombineResultType::FINISHED;
}